

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaTypePtr xmlSchemaGetType(xmlSchemaPtr schema,xmlChar *name,xmlChar *nsName)

{
  int iVar1;
  void *local_38;
  xmlSchemaImportPtr import;
  xmlSchemaTypePtr ret;
  xmlChar *nsName_local;
  xmlChar *name_local;
  xmlSchemaPtr schema_local;
  
  import = (xmlSchemaImportPtr)0x0;
  if (name == (xmlChar *)0x0) {
    schema_local = (xmlSchemaPtr)0x0;
  }
  else {
    if (((((nsName == (xmlChar *)0x0) || (iVar1 = xmlStrEqual(nsName,xmlSchemaNs), iVar1 == 0)) ||
         (import = (xmlSchemaImportPtr)xmlSchemaGetPredefinedType(name,nsName),
         (xmlSchemaTypePtr)import == (xmlSchemaTypePtr)0x0)) &&
        ((schema != (xmlSchemaPtr)0x0 &&
         ((iVar1 = xmlStrEqual(nsName,schema->targetNamespace), iVar1 == 0 ||
          (import = (xmlSchemaImportPtr)xmlHashLookup(schema->typeDecl,name),
          import == (xmlSchemaImportPtr)0x0)))))) &&
       (iVar1 = xmlHashSize(schema->schemasImports), 1 < iVar1)) {
      if (nsName == (xmlChar *)0x0) {
        local_38 = xmlHashLookup(schema->schemasImports,(xmlChar *)"##");
      }
      else {
        local_38 = xmlHashLookup(schema->schemasImports,nsName);
      }
      if (local_38 != (void *)0x0) {
        import = (xmlSchemaImportPtr)
                 xmlHashLookup(*(xmlHashTablePtr *)(*(long *)((long)local_38 + 0x50) + 0x38),name);
      }
    }
    schema_local = (xmlSchemaPtr)import;
  }
  return (xmlSchemaTypePtr)schema_local;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaGetType(xmlSchemaPtr schema, const xmlChar * name,
                 const xmlChar * nsName)
{
    xmlSchemaTypePtr ret = NULL;

    if (name == NULL)
        return (NULL);
    /* First try the built-in types. */
    if ((nsName != NULL) && xmlStrEqual(nsName, xmlSchemaNs)) {
	ret = xmlSchemaGetPredefinedType(name, nsName);
	if (ret != NULL)
	    goto exit;
	/*
	* Note that we try the parsed schemas as well here
	* since one might have parsed the S4S, which contain more
	* than the built-in types.
	* TODO: Can we optimize this?
	*/
    }
    if (schema != NULL) {
	WXS_FIND_GLOBAL_ITEM(typeDecl)
    }
exit:

#ifdef DEBUG
    if (ret == NULL) {
        if (nsName == NULL)
            fprintf(stderr, "Unable to lookup type %s", name);
        else
            fprintf(stderr, "Unable to lookup type %s:%s", name,
                    nsName);
    }
#endif
    return (ret);
}